

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_csr.c
# Opt level: O0

int mbedtls_x509write_csr_set_ns_cert_type(mbedtls_x509write_csr *ctx,uchar ns_cert_type)

{
  uchar *puStack_28;
  int ret;
  uchar *c;
  uchar buf [4];
  mbedtls_x509write_csr *pmStack_18;
  uchar ns_cert_type_local;
  mbedtls_x509write_csr *ctx_local;
  
  puStack_28 = (uchar *)((long)&c + 7);
  c._7_1_ = ns_cert_type;
  pmStack_18 = ctx;
  ctx_local._4_4_ =
       mbedtls_asn1_write_bitstring
                 (&stack0xffffffffffffffd8,(uchar *)((long)&c + 3),(uchar *)((long)&c + 7),8);
  if ((ctx_local._4_4_ == 4) &&
     (ctx_local._4_4_ =
           mbedtls_x509write_csr_set_extension
                     (pmStack_18,anon_var_dwarf_4455,9,(uchar *)((long)&c + 3),4),
     ctx_local._4_4_ == 0)) {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_x509write_csr_set_ns_cert_type( mbedtls_x509write_csr *ctx,
                                    unsigned char ns_cert_type )
{
    unsigned char buf[4];
    unsigned char *c;
    int ret;

    c = buf + 4;

    if( ( ret = mbedtls_asn1_write_bitstring( &c, buf, &ns_cert_type, 8 ) ) != 4 )
        return( ret );

    ret = mbedtls_x509write_csr_set_extension( ctx, MBEDTLS_OID_NS_CERT_TYPE,
                                       MBEDTLS_OID_SIZE( MBEDTLS_OID_NS_CERT_TYPE ),
                                       buf, 4 );
    if( ret != 0 )
        return( ret );

    return( 0 );
}